

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

int fy_node_sequence_insert_prepare(fy_node *fyn_seq,fy_node *fyn)

{
  int iVar1;
  
  iVar1 = -1;
  if ((((fyn != (fy_node *)0x0 && fyn_seq != (fy_node *)0x0) && ((fyn_seq->field_0x34 & 3) == 1)) &&
      ((fyn->field_0x34 & 8) == 0)) &&
     ((fyn_seq->fyd != (fy_document *)0x0 && (fyn->fyd == fyn_seq->fyd)))) {
    fyn->parent = fyn_seq;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int fy_node_sequence_insert_prepare(struct fy_node *fyn_seq, struct fy_node *fyn) {
    struct fy_document *fyd;

    if (!fyn_seq || !fyn || fyn_seq->type != FYNT_SEQUENCE)
        return -1;

    /* can't insert a node that's attached already */
    if (fyn->attached)
        return -1;

    /* a document must be associated with the sequence */
    fyd = fyn_seq->fyd;
    if (!fyd)
        return -1;

    /* the documents of the nodes must match */
    if (fyn->fyd != fyd)
        return -1;

    fyn->parent = fyn_seq;

    return 0;
}